

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

void __thiscall QPDF::showXRefTable(QPDF *this)

{
  _Base_ptr *this_00;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  _Alloc_hider this_01;
  int iVar2;
  Pipeline *pPVar3;
  qpdf_offset_t i;
  _Base_ptr p_Var4;
  logic_error *this_02;
  string local_50;
  
  QPDFLogger::getInfo((QPDFLogger *)&local_50,
                      SUB81(*(undefined8 *)
                             &((this->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log,0))
  ;
  this_01._M_p = local_50._M_dataplus._M_p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  p_Var4 = *(_Base_ptr *)((long)&(_Var1._M_head_impl)->xref_table + 0x18);
  do {
    if (p_Var4 == (_Rb_tree_node_base *)((long)&(_Var1._M_head_impl)->xref_table + 8U)) {
      return;
    }
    QPDFObjGen::unparse_abi_cxx11_(&local_50,(QPDFObjGen *)(p_Var4 + 1),'/');
    pPVar3 = Pipeline::operator<<((Pipeline *)this_01._M_p,&local_50);
    Pipeline::operator<<(pPVar3,": ");
    this_00 = &p_Var4[1]._M_parent;
    std::__cxx11::string::~string((string *)&local_50);
    iVar2 = QPDFXRefEntry::getType((QPDFXRefEntry *)this_00);
    if (iVar2 == 1) {
      pPVar3 = Pipeline::operator<<((Pipeline *)this_01._M_p,"uncompressed; offset = ");
      i = QPDFXRefEntry::getOffset((QPDFXRefEntry *)this_00);
      Pipeline::operator<<(pPVar3,i);
    }
    else {
      if (iVar2 != 2) {
        this_02 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_02,"unknown cross-reference table type while showing xref_table");
        __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      QPDFLogger::getInfo((QPDFLogger *)&local_50,
                          SUB81(*(undefined8 *)
                                 &((this->m)._M_t.
                                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                   .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log
                                ,0));
      pPVar3 = Pipeline::operator<<((Pipeline *)local_50._M_dataplus._M_p,"compressed; stream = ");
      iVar2 = QPDFXRefEntry::getObjStreamNumber((QPDFXRefEntry *)this_00);
      pPVar3 = Pipeline::operator<<(pPVar3,iVar2);
      pPVar3 = Pipeline::operator<<(pPVar3,", index = ");
      iVar2 = QPDFXRefEntry::getObjStreamIndex((QPDFXRefEntry *)this_00);
      Pipeline::operator<<(pPVar3,iVar2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
    }
    QPDFLogger::info(*(QPDFLogger **)
                      &((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log,"\n");
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

void
QPDF::showXRefTable()
{
    auto& cout = *m->log->getInfo();
    for (auto const& iter: m->xref_table) {
        QPDFObjGen const& og = iter.first;
        QPDFXRefEntry const& entry = iter.second;
        cout << og.unparse('/') << ": ";
        switch (entry.getType()) {
        case 1:
            cout << "uncompressed; offset = " << entry.getOffset();
            break;

        case 2:
            *m->log->getInfo() << "compressed; stream = " << entry.getObjStreamNumber()
                               << ", index = " << entry.getObjStreamIndex();
            break;

        default:
            throw std::logic_error("unknown cross-reference table type while showing xref_table");
            break;
        }
        m->log->info("\n");
    }
}